

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O1

void sysbvm_environment_setupPrimitives(sysbvm_context_t *context)

{
  sysbvm_tuple_t *psVar1;
  ulong immediateTypeTag;
  sysbvm_tuple_t ownerClass;
  
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).analysisQueueType,"waitPendingAnalysis",1,0,(void *)0x0,
             sysbvm_analysisQueue_primitive_waitPendingAnalysis);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).environmentType,"enqueuePendingAnalysis:",2,0,(void *)0x0,
             sysbvm_environment_primitive_enqueuePendingAnalysis);
  psVar1 = (sysbvm_tuple_t *)(context->roots).environmentType;
  immediateTypeTag = (ulong)psVar1 & 0xf;
  if (immediateTypeTag == 0 && psVar1 != (sysbvm_tuple_t *)0x0) {
    ownerClass = *psVar1;
  }
  else if ((int)immediateTypeTag == 0xf) {
    ownerClass = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)psVar1 >> 4);
  }
  else {
    ownerClass = sysbvm_tuple_getImmediateTypeWithTag(context,immediateTypeTag);
  }
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,ownerClass,"defaultForEvaluation",1,0,(void *)0x0,
             sysbvm_environment_primitive_defaultForEvaluation);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).environmentType,"setNewBinding:",2,4,(void *)0x0,
             sysbvm_environment_primitive_setNewBinding);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).environmentType,"setBinding:",2,4,(void *)0x0,
             sysbvm_environment_primitive_setBinding);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).environmentType,"setNewSymbol:bindingWithValue:",3,4,
             (void *)0x0,sysbvm_environment_primitive_setNewSymbolBindingWithValue);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).environmentType,"setSymbol:bindingWithValue:",3,4,(void *)0x0,
             sysbvm_environment_primitive_setSymbolBindingWithValue);
  return;
}

Assistant:

void sysbvm_environment_setupPrimitives(sysbvm_context_t *context)
{
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.analysisQueueType, "waitPendingAnalysis", 1, SYSBVM_FUNCTION_FLAGS_NONE, NULL, sysbvm_analysisQueue_primitive_waitPendingAnalysis);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.environmentType, "enqueuePendingAnalysis:", 2, SYSBVM_FUNCTION_FLAGS_NONE, NULL, sysbvm_environment_primitive_enqueuePendingAnalysis);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, sysbvm_tuple_getType(context, context->roots.environmentType), "defaultForEvaluation", 1, SYSBVM_FUNCTION_FLAGS_NONE, NULL, sysbvm_environment_primitive_defaultForEvaluation);

    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.environmentType, "setNewBinding:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_environment_primitive_setNewBinding);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.environmentType, "setBinding:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_environment_primitive_setBinding);
    
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.environmentType, "setNewSymbol:bindingWithValue:", 3, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_environment_primitive_setNewSymbolBindingWithValue);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.environmentType, "setSymbol:bindingWithValue:", 3, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_environment_primitive_setSymbolBindingWithValue);
}